

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_tessellation.cpp
# Opt level: O0

bool dxil_spv::emit_load_patch_constant_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  uint uVar3;
  StorageClass storageClass;
  Id IVar4;
  Id IVar5;
  mapped_type *pmVar6;
  Operation *pOVar7;
  Value *pVVar8;
  Operation *this;
  Operation *op;
  Operation *add_op;
  Id row_id;
  Operation *op_1;
  Id load_type_id;
  StorageClass storage;
  uint32_t num_cols;
  Id IStack_40;
  bool row_index;
  Id output_type_id;
  Id ptr_id;
  uint32_t var_id;
  mapped_type *meta;
  Builder *pBStack_28;
  uint32_t output_element_index;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand((Instruction *)builder,1,(uint32_t *)((long)&meta + 4));
  if (bVar2) {
    pmVar6 = std::
             unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>_>
             ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>_>
                           *)&instruction_local[0x13].super_Instruction.attachments._M_h.
                              _M_rehash_policy,(key_type *)((long)&meta + 4));
    IStack_40 = (pmVar6->super_ElementMeta).id;
    num_cols = spv::Builder::getDerefTypeId(pBStack_28,IStack_40);
    bVar2 = spv::Builder::isArrayType(pBStack_28,num_cols);
    if (bVar2) {
      num_cols = spv::Builder::getContainedTypeId(pBStack_28,num_cols);
    }
    uVar3 = spv::Builder::getNumTypeComponents(pBStack_28,num_cols);
    storageClass = StorageClassOutput;
    if ((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy._M_next_resize
        == 2) {
      storageClass = StorageClassInput;
    }
    if ((bVar2) || (1 < uVar3)) {
      op_1._4_4_ = spv::Builder::getScalarTypeId(pBStack_28,num_cols);
      pCVar1 = instruction_local;
      IVar4 = spv::Builder::makePointer(pBStack_28,storageClass,op_1._4_4_);
      pOVar7 = Converter::Impl::allocate((Impl *)pCVar1,OpAccessChain,IVar4);
      IVar4 = pOVar7->id;
      Operation::add_id(pOVar7,IStack_40);
      pCVar1 = instruction_local;
      if (bVar2) {
        pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
        add_op._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar8,0);
        pCVar1 = instruction_local;
        if ((pmVar6->super_ElementMeta).semantic_offset != 0) {
          IVar5 = spv::Builder::makeUintType(pBStack_28,0x20);
          this = Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar5);
          Operation::add_id(this,add_op._4_4_);
          IVar5 = spv::Builder::makeUintConstant
                            (pBStack_28,(pmVar6->super_ElementMeta).semantic_offset,false);
          Operation::add_id(this,IVar5);
          Converter::Impl::add((Impl *)instruction_local,this,false);
          add_op._4_4_ = this->id;
        }
        Operation::add_id(pOVar7,add_op._4_4_);
      }
      pCVar1 = instruction_local;
      if (1 < uVar3) {
        pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
        IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar8,0x20);
        Operation::add_id(pOVar7,IVar5);
      }
      Converter::Impl::add((Impl *)instruction_local,pOVar7,false);
      IStack_40 = IVar4;
    }
    else {
      op_1._4_4_ = num_cols;
    }
    pOVar7 = Converter::Impl::allocate((Impl *)instruction_local,OpLoad,(Value *)builder,op_1._4_4_)
    ;
    Operation::add_id(pOVar7,IStack_40);
    Converter::Impl::add((Impl *)instruction_local,pOVar7,false);
    Converter::Impl::fixup_load_type_io
              ((Impl *)instruction_local,(pmVar6->super_ElementMeta).component_type,1,
               (Value *)builder);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_load_patch_constant_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t output_element_index;
	if (!get_constant_operand(instruction, 1, &output_element_index))
		return false;

	const auto &meta = impl.patch_elements_meta[output_element_index];
	uint32_t var_id = meta.id;
	spv::Id ptr_id;

	spv::Id output_type_id = builder.getDerefTypeId(var_id);

	bool row_index = false;
	if (builder.isArrayType(output_type_id))
	{
		row_index = true;
		output_type_id = builder.getContainedTypeId(output_type_id);
	}
	uint32_t num_cols = builder.getNumTypeComponents(output_type_id);

	spv::StorageClass storage = impl.execution_model == spv::ExecutionModelTessellationEvaluation ?
	                                spv::StorageClassInput :
	                                spv::StorageClassOutput;

	spv::Id load_type_id;

	if (row_index || num_cols > 1)
	{
		load_type_id = builder.getScalarTypeId(output_type_id);
		Operation *op =
		    impl.allocate(spv::OpAccessChain, builder.makePointer(storage, load_type_id));
		ptr_id = op->id;
		op->add_id(var_id);

		if (row_index)
		{
			spv::Id row_id = impl.get_id_for_value(instruction->getOperand(2));

			if (meta.semantic_offset != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.semantic_offset));
				impl.add(add_op);

				row_id = add_op->id;
			}

			op->add_id(row_id);
		}

		if (num_cols > 1)
			op->add_id(impl.get_id_for_value(instruction->getOperand(3), 32));

		impl.add(op);
	}
	else
	{
		ptr_id = var_id;
		load_type_id = output_type_id;
	}

	Operation *op = impl.allocate(spv::OpLoad, instruction, load_type_id);
	op->add_id(ptr_id);
	impl.add(op);

	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	return true;
}